

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86_avx::forward
          (Crop_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *pCVar1;
  Mat *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mat *this_01;
  size_t sVar7;
  Option *pOVar8;
  int iVar9;
  sbyte sVar10;
  pointer pMVar11;
  int q;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int *_hoffset_00;
  void *__arg;
  ulong uVar15;
  bool bVar16;
  int _outw;
  int _outh;
  int _woffset;
  int local_1b0;
  int _outc;
  int _outd;
  int _hoffset;
  pointer local_1a0;
  int _coffset;
  Option *local_190;
  int local_184;
  int local_180;
  int _doffset;
  size_t local_178;
  Mat bottom_blob_unpacked;
  Mat reference_blob_unpacked;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  Mat local_78;
  
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = this_01 + 1;
  iVar12 = this_01->w;
  iVar9 = this_01->h;
  iVar2 = this_01->d;
  iVar3 = this_01->c;
  iVar4 = this_01->dims;
  sVar7 = this_01->elemsize;
  iVar5 = this_01->elempack;
  iVar6 = this_01[1].elempack;
  local_1a0 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_190 = opt;
  if (iVar5 == 4) {
    pCVar1 = (Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]);
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86_avx[-3]) == -0xe9) {
      local_1b0 = iVar9;
      local_184 = iVar3;
      local_180 = iVar2;
      local_178 = sVar7;
      ncnn::Mat::shape(&bottom_blob_unpacked,this_01);
      Crop::resolve_crop_roi
                (pCVar1,&bottom_blob_unpacked,(int *)this_01[1].data,&_woffset,&_hoffset,&_doffset,
                 &_coffset,&_outw,&_outh,&_outd,&_outc);
    }
    else {
      local_1b0 = iVar9;
      local_184 = iVar3;
      local_180 = iVar2;
      local_178 = sVar7;
      ncnn::Mat::shape(&bottom_blob_unpacked,this_01);
      ncnn::Mat::shape(&reference_blob_unpacked,this_00);
      Crop::resolve_crop_roi
                (pCVar1,&bottom_blob_unpacked,&reference_blob_unpacked,&_woffset,&_hoffset,&_doffset
                 ,&_coffset,&_outw,&_outh,&_outd,&_outc);
      ncnn::Mat::~Mat(&reference_blob_unpacked);
    }
    ncnn::Mat::~Mat(&bottom_blob_unpacked);
    pMVar11 = local_1a0;
    if (iVar4 - 1U < 4) {
      uVar14 = _outc >> 2;
      switch(iVar4) {
      case 1:
        uVar14 = _outw & 7;
        bVar16 = (_outw & 3U) == 0;
        iVar9 = (uint)bVar16 * 3 + 1;
        if (uVar14 == 0) {
          iVar9 = 8;
        }
        sVar10 = bVar16 * '\x02';
        if (uVar14 == 0) {
          sVar10 = 3;
        }
        if (uVar14 == 4 && iVar12 == _outw / iVar9) {
LAB_001af5c4:
          ncnn::Mat::operator=(local_1a0,this_01);
          return 0;
        }
        if ((uVar14 == 4) && ((_woffset & 3U) == 0)) {
          ncnn::Mat::create(local_1a0,_outw / iVar9,(local_178 >> 2) << sVar10,4,
                            local_190->blob_allocator);
          if (pMVar11->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar11->c * pMVar11->cstep != 0) {
            crop_pack4_sse(this_01,pMVar11,0,_woffset / 4);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        sVar10 = ((_outh & 3U) == 0) * '\x02';
        uVar14 = _outh & 7;
        if (uVar14 == 0) {
          sVar10 = 3;
        }
        if (_outw == iVar12) {
          iVar12 = (uint)((_outh & 3U) == 0) * 3 + 1;
          if (uVar14 == 0) {
            iVar12 = 8;
          }
          if ((uVar14 == 4) && (_outh / iVar12 == local_1b0)) goto LAB_001af5c4;
        }
        if ((uVar14 == 4) && ((_hoffset & 3U) == 0)) {
          ncnn::Mat::create(local_1a0,_outw,_outh >> 2,(local_178 >> 2) << sVar10,4,
                            local_190->blob_allocator);
          if (pMVar11->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar11->c * pMVar11->cstep != 0) {
            crop_pack4_sse(this_01,pMVar11,_hoffset / 4,_woffset);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar15 = local_178 >> 2;
        sVar10 = ((_outc & 3U) == 0) * '\x02';
        uVar13 = _outc & 7;
        if (uVar13 == 0) {
          sVar10 = 3;
        }
        if ((_outw == iVar12) && (_outh == local_1b0)) {
          iVar9 = (uint)((_outc & 3U) == 0) * 3 + 1;
          if (uVar13 == 0) {
            iVar9 = 8;
          }
          if ((uVar13 == 4) && (_outc / iVar9 == local_184)) goto LAB_001af5c4;
        }
        if (uVar13 == 4 && (_coffset & 3U) == 0) {
          __arg = (void *)(ulong)uVar14;
          ncnn::Mat::channel_range(&bottom_blob_unpacked,this_01,_coffset >> 2,uVar14);
          pOVar8 = local_190;
          pMVar11 = local_1a0;
          if (local_1b0 == _outh && iVar12 == _outw) {
            ncnn::Mat::clone(&reference_blob_unpacked,(__fn *)&bottom_blob_unpacked,(void *)0x0,
                             _outh,__arg);
            ncnn::Mat::operator=(pMVar11,&reference_blob_unpacked);
            ncnn::Mat::~Mat(&reference_blob_unpacked);
            iVar9 = -100;
            if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0))
            goto LAB_001afd06;
          }
          ncnn::Mat::create(pMVar11,_outw,_outh,_outc / 4,uVar15 << sVar10,4,pOVar8->blob_allocator)
          ;
          iVar9 = -100;
          if ((pMVar11->data != (void *)0x0) &&
             (uVar15 = (ulong)pMVar11->c, pMVar11->cstep * uVar15 != 0)) {
            iVar9 = 0;
            for (iVar12 = 0; iVar12 < (int)uVar15; iVar12 = iVar12 + 1) {
              ncnn::Mat::channel(&reference_blob_unpacked,&bottom_blob_unpacked,iVar12);
              ncnn::Mat::channel((Mat *)&bottom_blobs_unpacked,pMVar11,iVar12);
              crop_pack4_sse(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_hoffset,
                             _woffset);
              ncnn::Mat::~Mat((Mat *)&bottom_blobs_unpacked);
              ncnn::Mat::~Mat(&reference_blob_unpacked);
              uVar15 = (ulong)(uint)pMVar11->c;
            }
          }
          goto LAB_001afd06;
        }
        break;
      case 4:
        uVar15 = local_178 >> 2;
        sVar10 = ((_outc & 3U) == 0) * '\x02';
        uVar13 = _outc & 7;
        if (uVar13 == 0) {
          sVar10 = 3;
        }
        if (((_outw == iVar12) && (_outh == local_1b0)) && (_outd == local_180)) {
          iVar9 = (uint)((_outc & 3U) == 0) * 3 + 1;
          if (uVar13 == 0) {
            iVar9 = 8;
          }
          if ((uVar13 == 4) && (_outc / iVar9 == local_184)) goto LAB_001af5c4;
        }
        if (uVar13 == 4 && (_coffset & 3U) == 0) {
          ncnn::Mat::channel_range(&bottom_blob_unpacked,this_01,_coffset >> 2,uVar14);
          pMVar11 = local_1a0;
          if (local_180 == _outd && (local_1b0 == _outh && iVar12 == _outw)) {
            ncnn::Mat::clone(&reference_blob_unpacked,(__fn *)&bottom_blob_unpacked,(void *)0x0,
                             _outd,(void *)(ulong)(uint)_outh);
            pMVar11 = local_1a0;
            ncnn::Mat::operator=(local_1a0,&reference_blob_unpacked);
            ncnn::Mat::~Mat(&reference_blob_unpacked);
            iVar9 = -100;
            if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0))
            goto LAB_001afd06;
          }
          ncnn::Mat::create(pMVar11,_outw,_outh,_outd,_outc / 4,uVar15 << sVar10,4,
                            local_190->blob_allocator);
          iVar9 = -100;
          if ((pMVar11->data != (void *)0x0) &&
             (uVar15 = (ulong)pMVar11->c, pMVar11->cstep * uVar15 != 0)) {
            for (iVar12 = 0; iVar12 < (int)uVar15; iVar12 = iVar12 + 1) {
              for (iVar9 = 0; iVar9 < _outd; iVar9 = iVar9 + 1) {
                ncnn::Mat::channel((Mat *)&bottom_blobs_unpacked,&bottom_blob_unpacked,iVar12);
                ncnn::Mat::depth(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,
                                 _doffset + iVar9);
                ncnn::Mat::~Mat((Mat *)&bottom_blobs_unpacked);
                ncnn::Mat::channel(&local_78,local_1a0,iVar12);
                ncnn::Mat::depth((Mat *)&bottom_blobs_unpacked,&local_78,iVar9);
                ncnn::Mat::~Mat(&local_78);
                crop_pack4_sse(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_hoffset,
                               _woffset);
                ncnn::Mat::~Mat((Mat *)&bottom_blobs_unpacked);
                ncnn::Mat::~Mat(&reference_blob_unpacked);
              }
              uVar15 = (ulong)(uint)local_1a0->c;
            }
            iVar9 = 0;
          }
          goto LAB_001afd06;
        }
      }
    }
  }
  else if (iVar5 == 8) {
    pCVar1 = (Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]);
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86_avx[-3]) == -0xe9) {
      local_1b0 = iVar9;
      local_184 = iVar3;
      local_180 = iVar2;
      local_178 = sVar7;
      ncnn::Mat::shape(&bottom_blob_unpacked,this_01);
      _hoffset_00 = &_hoffset;
      Crop::resolve_crop_roi
                (pCVar1,&bottom_blob_unpacked,(int *)this_01[1].data,&_woffset,_hoffset_00,&_doffset
                 ,&_coffset,&_outw,&_outh,&_outd,&_outc);
    }
    else {
      local_1b0 = iVar9;
      local_184 = iVar3;
      local_180 = iVar2;
      local_178 = sVar7;
      ncnn::Mat::shape(&bottom_blob_unpacked,this_01);
      ncnn::Mat::shape(&reference_blob_unpacked,this_00);
      _hoffset_00 = &_hoffset;
      Crop::resolve_crop_roi
                (pCVar1,&bottom_blob_unpacked,&reference_blob_unpacked,&_woffset,_hoffset_00,
                 &_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
      ncnn::Mat::~Mat(&reference_blob_unpacked);
    }
    ncnn::Mat::~Mat(&bottom_blob_unpacked);
    pMVar11 = local_1a0;
    switch(iVar4) {
    case 1:
      uVar14 = _outw & 7;
      bVar16 = (_outw & 3U) == 0;
      iVar9 = (uint)bVar16 * 3 + 1;
      if (uVar14 == 0) {
        iVar9 = 8;
      }
      sVar10 = bVar16 * '\x02';
      if (uVar14 == 0) {
        sVar10 = 3;
      }
      if (iVar12 == _outw / iVar9 && uVar14 == 0) goto LAB_001af5c4;
      if (((_outw | _woffset) & 7U) == 0) {
        ncnn::Mat::create(local_1a0,_outw / iVar9,(local_178 >> 3) << sVar10,8,
                          local_190->blob_allocator);
        if (pMVar11->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar11->c * pMVar11->cstep != 0) {
          crop_pack8_avx(this_01,pMVar11,0,_woffset / 8);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      sVar10 = ((_outh & 3U) == 0) * '\x02';
      if ((_outh & 7U) == 0) {
        sVar10 = 3;
      }
      if (_outw == iVar12) {
        iVar12 = (uint)((_outh & 3U) == 0) * 3 + 1;
        if ((_outh & 7U) == 0) {
          iVar12 = 8;
        }
        if (((_outh & 7U) == 0) && (_outh / iVar12 == local_1b0)) goto LAB_001af5c4;
      }
      if (((_hoffset | _outh) & 7U) == 0) {
        ncnn::Mat::create(local_1a0,_outw,_outh / 8,(local_178 >> 3) << sVar10,8,
                          local_190->blob_allocator);
        if (pMVar11->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar11->c * pMVar11->cstep != 0) {
          crop_pack8_avx(this_01,pMVar11,_hoffset / 8,_woffset);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      uVar15 = local_178 >> 3;
      sVar10 = ((_outc & 3U) == 0) * '\x02';
      if ((_outc & 7U) == 0) {
        sVar10 = 3;
      }
      if ((_outw == iVar12) && (_outh == local_1b0)) {
        iVar9 = (uint)((_outc & 3U) == 0) * 3 + 1;
        if ((_outc & 7U) == 0) {
          iVar9 = 8;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar9 == local_184)) goto LAB_001af5c4;
      }
      if (((_coffset | _outc) & 7U) == 0) {
        ncnn::Mat::channel_range(&bottom_blob_unpacked,this_01,_coffset / 8,_outc / 8);
        pOVar8 = local_190;
        pMVar11 = local_1a0;
        if (local_1b0 == _outh && iVar12 == _outw) {
          ncnn::Mat::clone(&reference_blob_unpacked,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outh,
                           _hoffset_00);
          ncnn::Mat::operator=(pMVar11,&reference_blob_unpacked);
          ncnn::Mat::~Mat(&reference_blob_unpacked);
          iVar9 = -100;
          if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0))
          goto LAB_001afd06;
        }
        ncnn::Mat::create(pMVar11,_outw,_outh,_outc / 8,uVar15 << sVar10,8,pOVar8->blob_allocator);
        iVar9 = -100;
        if ((pMVar11->data != (void *)0x0) &&
           (uVar15 = (ulong)pMVar11->c, pMVar11->cstep * uVar15 != 0)) {
          iVar9 = 0;
          for (iVar12 = 0; iVar12 < (int)uVar15; iVar12 = iVar12 + 1) {
            ncnn::Mat::channel(&reference_blob_unpacked,&bottom_blob_unpacked,iVar12);
            ncnn::Mat::channel((Mat *)&bottom_blobs_unpacked,pMVar11,iVar12);
            crop_pack8_avx(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset)
            ;
            ncnn::Mat::~Mat((Mat *)&bottom_blobs_unpacked);
            ncnn::Mat::~Mat(&reference_blob_unpacked);
            uVar15 = (ulong)(uint)pMVar11->c;
          }
        }
        goto LAB_001afd06;
      }
      break;
    case 4:
      uVar15 = local_178 >> 3;
      sVar10 = ((_outc & 3U) == 0) * '\x02';
      if ((_outc & 7U) == 0) {
        sVar10 = 3;
      }
      if (((_outw == iVar12) && (_outh == local_1b0)) && (_outd == local_180)) {
        iVar9 = (uint)((_outc & 3U) == 0) * 3 + 1;
        if ((_outc & 7U) == 0) {
          iVar9 = 8;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar9 == local_184)) goto LAB_001af5c4;
      }
      if (((_coffset | _outc) & 7U) == 0) {
        iVar9 = -100;
        ncnn::Mat::channel_range(&bottom_blob_unpacked,this_01,_coffset / 8,_outc / 8);
        pMVar11 = local_1a0;
        if (local_180 == _outd && (local_1b0 == _outh && iVar12 == _outw)) {
          ncnn::Mat::clone(&reference_blob_unpacked,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outd,
                           (void *)(ulong)(uint)_outh);
          pMVar11 = local_1a0;
          ncnn::Mat::operator=(local_1a0,&reference_blob_unpacked);
          ncnn::Mat::~Mat(&reference_blob_unpacked);
          if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0))
          goto LAB_001afd06;
        }
        ncnn::Mat::create(pMVar11,_outw,_outh,_outd,_outc / 8,uVar15 << sVar10,8,
                          local_190->blob_allocator);
        if ((pMVar11->data != (void *)0x0) &&
           (uVar15 = (ulong)pMVar11->c, pMVar11->cstep * uVar15 != 0)) {
          for (iVar12 = 0; iVar12 < (int)uVar15; iVar12 = iVar12 + 1) {
            for (iVar9 = 0; iVar9 < _outd; iVar9 = iVar9 + 1) {
              ncnn::Mat::channel((Mat *)&bottom_blobs_unpacked,&bottom_blob_unpacked,iVar12);
              ncnn::Mat::depth(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,
                               _doffset + iVar9);
              ncnn::Mat::~Mat((Mat *)&bottom_blobs_unpacked);
              ncnn::Mat::channel(&local_78,local_1a0,iVar12);
              ncnn::Mat::depth((Mat *)&bottom_blobs_unpacked,&local_78,iVar9);
              ncnn::Mat::~Mat(&local_78);
              crop_pack8_avx(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_hoffset,
                             _woffset);
              ncnn::Mat::~Mat((Mat *)&bottom_blobs_unpacked);
              ncnn::Mat::~Mat(&reference_blob_unpacked);
            }
            uVar15 = (ulong)(uint)local_1a0->c;
          }
          iVar9 = 0;
        }
        goto LAB_001afd06;
      }
    }
  }
  ncnn::Mat::Mat(&bottom_blob_unpacked,this_01);
  pOVar8 = local_190;
  if (iVar5 != 1) {
    reference_blob_unpacked.data = *(void **)local_190;
    reference_blob_unpacked.elemsize = (size_t)local_190->workspace_allocator;
    reference_blob_unpacked.elempack = local_190->openmp_blocktime;
    reference_blob_unpacked._28_1_ = local_190->use_winograd_convolution;
    reference_blob_unpacked._29_1_ = local_190->use_sgemm_convolution;
    reference_blob_unpacked._30_1_ = local_190->use_int8_inference;
    reference_blob_unpacked._31_1_ = local_190->use_vulkan_compute;
    reference_blob_unpacked.allocator = *(Allocator **)&local_190->use_bf16_storage;
    reference_blob_unpacked._40_8_ = *(undefined8 *)&local_190->use_shader_pack8;
    reference_blob_unpacked._48_8_ = *(undefined8 *)&local_190->flush_denormals;
    reference_blob_unpacked._56_8_ = *(undefined8 *)&local_190->use_reserved_4;
    reference_blob_unpacked.refcount = (int *)local_190->workspace_allocator;
    convert_packing(this_01,&bottom_blob_unpacked,1,(Option *)&reference_blob_unpacked);
  }
  ncnn::Mat::Mat(&reference_blob_unpacked,this_00);
  if (iVar6 != 1) {
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)pOVar8;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pOVar8->workspace_allocator;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pOVar8->workspace_allocator;
    convert_packing(this_00,&reference_blob_unpacked,1,(Option *)&bottom_blobs_unpacked);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,2,(allocator_type *)&local_78);
  ncnn::Mat::operator=
            (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start,&bottom_blob_unpacked);
  ncnn::Mat::operator=
            (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start + 1,&reference_blob_unpacked);
  iVar9 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86_avx +
                                (long)this->_vptr_Crop_x86_avx[-3]),&bottom_blobs_unpacked,top_blobs
                        ,pOVar8);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  ncnn::Mat::~Mat(&reference_blob_unpacked);
LAB_001afd06:
  ncnn::Mat::~Mat(&bottom_blob_unpacked);
  return iVar9;
}

Assistant:

int Crop_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}